

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeAtomicsObject
               (DynamicObject *atomicsObject,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  undefined8 in_RAX;
  RuntimeFunction *pRVar1;
  StaticType *type;
  LiteralString *pLVar2;
  uint uVar4;
  ulong uVar3;
  
  uVar4 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,atomicsObject,mode,0xc,0);
  this = (((atomicsObject->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)AtomicsObject::EntryInfo::Add,3,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x4a);
  uVar3 = (ulong)uVar4 << 0x20;
  (*(atomicsObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(atomicsObject,0x4a,pRVar1,6,0,0,uVar3);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)AtomicsObject::EntryInfo::And,3,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x47);
  uVar3 = uVar3 & 0xffffffff00000000;
  (*(atomicsObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(atomicsObject,0x47,pRVar1,6,0,0,uVar3);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)AtomicsObject::EntryInfo::CompareExchange,4,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x2cd);
  uVar3 = uVar3 & 0xffffffff00000000;
  (*(atomicsObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(atomicsObject,0x2cd,pRVar1,6,0,0,uVar3);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)AtomicsObject::EntryInfo::Exchange,3,(DynamicObject *)0x0
                      ,(DynamicType *)0x0,0x2ce);
  uVar3 = uVar3 & 0xffffffff00000000;
  (*(atomicsObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(atomicsObject,0x2ce,pRVar1,6,0,0,uVar3);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)AtomicsObject::EntryInfo::IsLockFree,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x2cf);
  uVar3 = uVar3 & 0xffffffff00000000;
  (*(atomicsObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(atomicsObject,0x2cf,pRVar1,6,0,0,uVar3);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)AtomicsObject::EntryInfo::Load,2,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x45);
  uVar3 = uVar3 & 0xffffffff00000000;
  (*(atomicsObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(atomicsObject,0x45,pRVar1,6,0,0,uVar3);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)AtomicsObject::EntryInfo::Or,3,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x48);
  uVar3 = uVar3 & 0xffffffff00000000;
  (*(atomicsObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(atomicsObject,0x48,pRVar1,6,0,0,uVar3);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)AtomicsObject::EntryInfo::Store,3,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x46);
  uVar3 = uVar3 & 0xffffffff00000000;
  (*(atomicsObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(atomicsObject,0x46,pRVar1,6,0,0,uVar3);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)AtomicsObject::EntryInfo::Sub,3,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x15d);
  uVar3 = uVar3 & 0xffffffff00000000;
  (*(atomicsObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(atomicsObject,0x15d,pRVar1,6,0,0,uVar3);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)AtomicsObject::EntryInfo::Wait,4,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x2d0);
  uVar3 = uVar3 & 0xffffffff00000000;
  (*(atomicsObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(atomicsObject,0x2d0,pRVar1,6,0,0,uVar3);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)AtomicsObject::EntryInfo::Notify,3,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x2d1);
  uVar3 = uVar3 & 0xffffffff00000000;
  (*(atomicsObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(atomicsObject,0x2d1,pRVar1,6,0,0,uVar3);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)AtomicsObject::EntryInfo::Xor,3,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x49);
  uVar3 = uVar3 & 0xffffffff00000000;
  (*(atomicsObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(atomicsObject,0x49,pRVar1,6,0,0,uVar3);
  if (((((((((atomicsObject->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig)->m_ES6ToStringTag ==
      true) {
    type = StringCache::GetStringTypeStatic(&this->stringCache);
    pLVar2 = LiteralString::New(type,L"Atomics",7,this->recycler);
    (*(atomicsObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])
              (atomicsObject,0x1b,pLVar2,2,0,0,uVar3 & 0xffffffff00000000);
  }
  DynamicObject::SetHasNoEnumerableProperties(atomicsObject,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeAtomicsObject(DynamicObject* atomicsObject, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(atomicsObject, mode, 12);

        JavascriptLibrary* library = atomicsObject->GetLibrary();

        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::add, &AtomicsObject::EntryInfo::Add, 3);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::and_, &AtomicsObject::EntryInfo::And, 3);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::compareExchange, &AtomicsObject::EntryInfo::CompareExchange, 4);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::exchange, &AtomicsObject::EntryInfo::Exchange, 3);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::isLockFree, &AtomicsObject::EntryInfo::IsLockFree, 1);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::load, &AtomicsObject::EntryInfo::Load, 2);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::or_, &AtomicsObject::EntryInfo::Or, 3);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::store, &AtomicsObject::EntryInfo::Store, 3);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::sub, &AtomicsObject::EntryInfo::Sub, 3);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::wait, &AtomicsObject::EntryInfo::Wait, 4);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::notify, &AtomicsObject::EntryInfo::Notify, 3);
        library->AddFunctionToLibraryObject(atomicsObject, PropertyIds::xor_, &AtomicsObject::EntryInfo::Xor, 3);

        if (atomicsObject->GetScriptContext()->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(atomicsObject, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("Atomics")), PropertyConfigurable);
        }

        atomicsObject->SetHasNoEnumerableProperties(true);

        return true;
    }